

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Extractor::~Extractor(Extractor *this)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *unaff_retaddr;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::clear
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x16d6fc);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

Extractor::~Extractor()
{
    blob_mats.clear();

#if NCNN_VULKAN
    if (net->opt.use_vulkan_compute)
    {
        blob_mats_gpu.clear();
        blob_mats_gpu_image.clear();

        if (local_blob_vkallocator)
        {
            net->vkdev->reclaim_blob_allocator(local_blob_vkallocator);
        }
        if (local_staging_vkallocator)
        {
            net->vkdev->reclaim_staging_allocator(local_staging_vkallocator);
        }
    }
#endif // NCNN_VULKAN
}